

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O2

void __thiscall
Eigen::internal::
permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>,1,true>
::evalTo<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>>
          (permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>,1,true>
           *this,Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true> *dst)

{
  double dVar1;
  long lVar2;
  Scalar *pSVar3;
  long *plVar4;
  long lVar5;
  long i;
  long index;
  Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false> local_c8;
  Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false> local_88;
  long local_48;
  void *local_40;
  Matrix<bool,__1,_1,_0,__1,_1> mask;
  
  if ((dst->super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data ==
      *(PointerType *)(this + 8)) {
    Matrix<bool,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<bool,__1,_1,_0,__1,_1> *)&local_40,(long)*(int *)(*(long *)this + 8));
    local_88.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
    .m_data._0_1_ = 0;
    DenseBase<Eigen::Matrix<bool,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_> *)&local_40,(Scalar *)&local_88);
    plVar4 = *(long **)this;
    lVar2 = 0;
    while (lVar5 = plVar4[1], index = lVar2, lVar2 < (int)lVar5) {
      for (; lVar2 = (long)(int)lVar5, index < lVar2; index = index + 1) {
        pSVar3 = DenseCoeffsBase<Eigen::Matrix<bool,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>,_1> *)&local_40,
                            index);
        plVar4 = *(long **)this;
        if (*pSVar3 == false) {
          lVar2 = (long)(int)plVar4[1];
          break;
        }
        lVar5 = plVar4[1];
      }
      if (lVar2 <= index) break;
      local_48 = index + 1;
      *(undefined1 *)((long)local_40 + index) = 1;
      lVar5 = index;
      while (i = (long)*(int *)(*plVar4 + lVar5 * 4), lVar2 = local_48, i != index) {
        Block<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_1,_1,_false>::Block
                  (&local_88,dst,i);
        Block<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_1,_1,_false>::Block
                  (&local_c8,dst,lVar5);
        dVar1 = *(double *)
                 CONCAT71(local_88.
                          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
                          .m_data._1_7_,
                          local_88.
                          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
                          .m_data._0_1_);
        *(double *)
         CONCAT71(local_88.
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
                  .m_data._1_7_,
                  local_88.
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
                  .m_data._0_1_) =
             *local_c8.
              super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
              .m_data;
        *local_c8.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
         .m_data = dVar1;
        *(undefined1 *)((long)local_40 + i) = 1;
        plVar4 = *(long **)this;
        lVar5 = i;
      }
    }
    free(local_40);
  }
  else {
    lVar5 = 0;
    lVar2 = *(long *)(this + 0x10);
    if (*(long *)(this + 0x10) < 1) {
      lVar2 = lVar5;
    }
    for (; lVar2 != lVar5; lVar5 = lVar5 + 1) {
      Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_1,_1,_false>::
      Block((Block<const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>
             *)&local_88,(Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true> *)(this + 8),
            (long)*(int *)(**(long **)this + lVar5 * 4));
      Block<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_1,_1,_false>::Block
                (&local_c8,dst,lVar5);
      *local_c8.
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
       .m_data = *(double *)
                  CONCAT71(local_88.
                           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
                           .m_data._1_7_,
                           local_88.
                           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1,_1,_false>,_0>
                           .m_data._0_1_);
    }
  }
  return;
}

Assistant:

inline void evalTo(Dest& dst) const
    {
      const Index n = Side==OnTheLeft ? rows() : cols();
      // FIXME we need an is_same for expression that is not sensitive to constness. For instance
      // is_same_xpr<Block<const Matrix>, Block<Matrix> >::value should be true.
      if(    is_same<MatrixTypeNestedCleaned,Dest>::value
          && blas_traits<MatrixTypeNestedCleaned>::HasUsableDirectAccess
          && blas_traits<Dest>::HasUsableDirectAccess
          && extract_data(dst) == extract_data(m_matrix))
      {
        // apply the permutation inplace
        Matrix<bool,PermutationType::RowsAtCompileTime,1,0,PermutationType::MaxRowsAtCompileTime> mask(m_permutation.size());
        mask.fill(false);
        Index r = 0;
        while(r < m_permutation.size())
        {
          // search for the next seed
          while(r<m_permutation.size() && mask[r]) r++;
          if(r>=m_permutation.size())
            break;
          // we got one, let's follow it until we are back to the seed
          Index k0 = r++;
          Index kPrev = k0;
          mask.coeffRef(k0) = true;
          for(Index k=m_permutation.indices().coeff(k0); k!=k0; k=m_permutation.indices().coeff(k))
          {
                  Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>(dst, k)
            .swap(Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
                       (dst,((Side==OnTheLeft) ^ Transposed) ? k0 : kPrev));

            mask.coeffRef(k) = true;
            kPrev = k;
          }
        }
      }
      else
      {
        for(int i = 0; i < n; ++i)
        {
          Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
               (dst, ((Side==OnTheLeft) ^ Transposed) ? m_permutation.indices().coeff(i) : i)

          =

          Block<const MatrixTypeNestedCleaned,Side==OnTheLeft ? 1 : MatrixType::RowsAtCompileTime,Side==OnTheRight ? 1 : MatrixType::ColsAtCompileTime>
               (m_matrix, ((Side==OnTheRight) ^ Transposed) ? m_permutation.indices().coeff(i) : i);
        }
      }
    }